

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

uint8_t __thiscall
icu_63::Normalizer2Impl::getPreviousTrailCC(Normalizer2Impl *this,UChar *start,UChar *p)

{
  uint16_t uVar1;
  int iVar2;
  int iVar3;
  uint local_30;
  uint16_t __c2;
  UChar32 c;
  int32_t i;
  UChar *p_local;
  UChar *start_local;
  Normalizer2Impl *this_local;
  
  if (start == p) {
    this_local._7_1_ = '\0';
  }
  else {
    iVar2 = (int)((long)p - (long)start >> 1);
    iVar3 = iVar2 + -1;
    local_30 = (uint)(ushort)start[iVar3];
    if ((((local_30 & 0xfffffc00) == 0xdc00) && (0 < iVar3)) &&
       ((start[iVar2 + -2] & 0xfc00U) == 0xd800)) {
      local_30 = (uint)(ushort)start[iVar2 + -2] * 0x400 + local_30 + 0xfca02400;
    }
    uVar1 = getFCD16(this,local_30);
    this_local._7_1_ = (uint8_t)uVar1;
  }
  return this_local._7_1_;
}

Assistant:

uint8_t Normalizer2Impl::getPreviousTrailCC(const UChar *start, const UChar *p) const {
    if (start == p) {
        return 0;
    }
    int32_t i = (int32_t)(p - start);
    UChar32 c;
    U16_PREV(start, 0, i, c);
    return (uint8_t)getFCD16(c);
}